

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall
cmCTestGlobalVC::WriteXMLDirectory
          (cmCTestGlobalVC *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  Directory *path_00;
  string *psVar1;
  char cVar2;
  bool bVar3;
  pointer ppVar4;
  pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string full;
  _Self local_98;
  const_iterator fi;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *slash;
  Directory *dir_local;
  string *path_local;
  cmXMLWriter *xml_local;
  cmCTestGlobalVC *this_local;
  
  slash = (char *)dir;
  dir_local = (Directory *)path;
  path_local = (string *)xml;
  xml_local = (cmXMLWriter *)this;
  cVar2 = std::__cxx11::string::empty();
  psVar1 = path_local;
  local_30 = "/";
  if (cVar2 != '\0') {
    local_30 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"Directory",&local_51);
  cmXMLWriter::StartElement((cmXMLWriter *)psVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  psVar1 = path_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"Name",(allocator *)((long)&fi._M_node + 7));
  cmXMLWriter::Element<std::__cxx11::string>
            ((cmXMLWriter *)psVar1,&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fi._M_node + 7));
  local_98._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                *)slash);
  while( true ) {
    full.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
                *)slash);
    bVar3 = std::operator!=(&local_98,(_Self *)((long)&full.field_2 + 8));
    if (!bVar3) break;
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_local,
                   local_30);
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>
             ::operator->(&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_e0,&ppVar4->first);
    std::__cxx11::string::~string((string *)&local_e0);
    psVar1 = path_local;
    path_00 = dir_local;
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>
             ::operator->(&local_98);
    ppVar5 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>
             ::operator->(&local_98);
    cmCTestVC::WriteXMLEntry
              (&this->super_cmCTestVC,(cmXMLWriter *)psVar1,(string *)path_00,&ppVar4->first,
               (string *)local_c0,&ppVar5->second);
    std::__cxx11::string::~string((string *)local_c0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>
    ::operator++(&local_98);
  }
  cmXMLWriter::EndElement((cmXMLWriter *)path_local);
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLDirectory(cmXMLWriter& xml,
                                        std::string const& path,
                                        Directory const& dir)
{
  const char* slash = path.empty()? "":"/";
  xml.StartElement("Directory");
  xml.Element("Name", path);
  for(Directory::const_iterator fi = dir.begin(); fi != dir.end(); ++fi)
    {
    std::string full = path + slash + fi->first;
    this->WriteXMLEntry(xml, path, fi->first, full, fi->second);
    }
  xml.EndElement(); // Directory
}